

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

char * nullcGetArgumentVector(uint functionID,uintptr_t extra,__va_list_tag *args)

{
  uint uVar1;
  float fVar2;
  uintptr_t *puVar3;
  uintptr_t uVar4;
  int iVar5;
  ExternFuncInfo *pEVar6;
  ExternLocalInfo *pEVar7;
  ExternTypeInfo *pEVar8;
  ExternMemberInfo *pEVar9;
  ExternTypeInfo *pEVar10;
  uintptr_t *local_1b0;
  double *local_190;
  uintptr_t *local_170;
  float *local_158;
  uintptr_t *local_138;
  uintptr_t *local_118;
  double *local_f8;
  uintptr_t *local_d8;
  float *local_c0;
  ExternTypeInfo *subType;
  uint k;
  ExternMemberInfo *memberList;
  ExternTypeInfo *tInfo;
  ExternLocalInfo *lInfo;
  float *pfStack_38;
  uint i;
  char *argPos;
  ExternFuncInfo *func;
  __va_list_tag *args_local;
  uintptr_t extra_local;
  uint functionID_local;
  
  pEVar6 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                     ((FastVector<ExternFuncInfo,_false,_false> *)(NULLC::linker + 0x240),functionID
                     );
  pfStack_38 = NULLC::argBuf;
  lInfo._4_4_ = 0;
  do {
    if (pEVar6->paramCount <= lInfo._4_4_) {
      *(uintptr_t *)pfStack_38 = extra;
      return (char *)NULLC::argBuf;
    }
    pEVar7 = FastVector<ExternLocalInfo,_false,_false>::operator[]
                       ((FastVector<ExternLocalInfo,_false,_false> *)(NULLC::linker + 0x270),
                        pEVar6->offsetToFirstLocal + lInfo._4_4_);
    pEVar8 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(NULLC::linker + 0x200),
                        pEVar7->type);
    switch(pEVar8->type) {
    case TYPE_COMPLEX:
      if ((nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)::autoRefHash == '\0')
         && (iVar5 = __cxa_guard_acquire(&nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)
                                          ::autoRefHash), iVar5 != 0)) {
        nullcGetArgumentVector::autoRefHash = NULLC::GetStringHash("auto ref");
        __cxa_guard_release(&nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)::
                             autoRefHash);
      }
      if ((nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)::autoArrayHash == '\0')
         && (iVar5 = __cxa_guard_acquire(&nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)
                                          ::autoArrayHash), iVar5 != 0)) {
        nullcGetArgumentVector::autoArrayHash = NULLC::GetStringHash("auto[]");
        __cxa_guard_release(&nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)::
                             autoArrayHash);
      }
      if (((pEVar8->subCat == CAT_ARRAY) && ((pEVar8->field_8).arrSize == 0xffffffff)) ||
         (pEVar8->subCat == CAT_FUNCTION)) {
        uVar1 = args->gp_offset;
        if (uVar1 < 0x21) {
          local_138 = (uintptr_t *)((long)(int)uVar1 + (long)args->reg_save_area);
          args->gp_offset = uVar1 + 0x10;
        }
        else {
          local_138 = (uintptr_t *)args->overflow_arg_area;
          args->overflow_arg_area = local_138 + 2;
        }
        fVar2 = *(float *)(local_138 + 1);
        *(uintptr_t *)pfStack_38 = *local_138;
        pfStack_38[2] = fVar2;
        pfStack_38 = pfStack_38 + 3;
      }
      else if (pEVar8->nameHash == nullcGetArgumentVector::autoRefHash) {
        puVar3 = (uintptr_t *)args->overflow_arg_area;
        args->overflow_arg_area = puVar3 + 2;
        fVar2 = *(float *)(puVar3 + 1);
        *(uintptr_t *)pfStack_38 = *puVar3;
        pfStack_38[2] = fVar2;
        pfStack_38 = pfStack_38 + 3;
      }
      else if (pEVar8->nameHash == nullcGetArgumentVector::autoArrayHash) {
        puVar3 = (uintptr_t *)args->overflow_arg_area;
        args->overflow_arg_area = puVar3 + 2;
        uVar4 = puVar3[1];
        *(uintptr_t *)pfStack_38 = *puVar3;
        *(uintptr_t *)(pfStack_38 + 2) = uVar4;
        pfStack_38 = pfStack_38 + 4;
      }
      else {
        if (pEVar8->subCat != CAT_CLASS) {
          NULLC::nullcLastError = "ERROR: unsupported complex function parameter";
          return (char *)0x0;
        }
        pEVar9 = FastVector<ExternMemberInfo,_false,_false>::operator[]
                           ((FastVector<ExternMemberInfo,_false,_false> *)(NULLC::linker + 0x210),
                            (pEVar8->field_11).subType);
        for (subType._4_4_ = 0; subType._4_4_ < (pEVar8->field_8).arrSize;
            subType._4_4_ = subType._4_4_ + 1) {
          pEVar10 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                              ((FastVector<ExternTypeInfo,_false,_false> *)(NULLC::linker + 0x200),
                               pEVar9[subType._4_4_].type);
          switch(pEVar10->type) {
          case TYPE_INT:
          case TYPE_SHORT:
          case TYPE_CHAR:
            uVar1 = args->gp_offset;
            if (uVar1 < 0x29) {
              local_158 = (float *)((long)(int)uVar1 + (long)args->reg_save_area);
              args->gp_offset = uVar1 + 8;
            }
            else {
              local_158 = (float *)args->overflow_arg_area;
              args->overflow_arg_area = local_158 + 2;
            }
            *pfStack_38 = *local_158;
            pfStack_38 = pfStack_38 + 1;
            break;
          case TYPE_FLOAT:
            uVar1 = args->fp_offset;
            if (uVar1 < 0xa1) {
              local_190 = (double *)((long)(int)uVar1 + (long)args->reg_save_area);
              args->fp_offset = uVar1 + 0x10;
            }
            else {
              local_190 = (double *)args->overflow_arg_area;
              args->overflow_arg_area = local_190 + 1;
            }
            *pfStack_38 = (float)*local_190;
            pfStack_38 = pfStack_38 + 1;
            break;
          case TYPE_LONG:
            uVar1 = args->gp_offset;
            if (uVar1 < 0x29) {
              local_170 = (uintptr_t *)((long)(int)uVar1 + (long)args->reg_save_area);
              args->gp_offset = uVar1 + 8;
            }
            else {
              local_170 = (uintptr_t *)args->overflow_arg_area;
              args->overflow_arg_area = local_170 + 1;
            }
            *(uintptr_t *)pfStack_38 = *local_170;
            pfStack_38 = pfStack_38 + 2;
            break;
          case TYPE_DOUBLE:
            uVar1 = args->fp_offset;
            if (uVar1 < 0xa1) {
              local_1b0 = (uintptr_t *)((long)(int)uVar1 + (long)args->reg_save_area);
              args->fp_offset = uVar1 + 0x10;
            }
            else {
              local_1b0 = (uintptr_t *)args->overflow_arg_area;
              args->overflow_arg_area = local_1b0 + 1;
            }
            *(uintptr_t *)pfStack_38 = *local_1b0;
            pfStack_38 = pfStack_38 + 2;
            break;
          default:
            NULLC::nullcLastError = "ERROR: unsupported complex function parameter";
            return (char *)0x0;
          }
        }
      }
      break;
    case TYPE_VOID:
      break;
    case TYPE_INT:
    case TYPE_SHORT:
    case TYPE_CHAR:
      uVar1 = args->gp_offset;
      if (uVar1 < 0x29) {
        local_c0 = (float *)((long)(int)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        local_c0 = (float *)args->overflow_arg_area;
        args->overflow_arg_area = local_c0 + 2;
      }
      *pfStack_38 = *local_c0;
      pfStack_38 = pfStack_38 + 1;
      break;
    case TYPE_FLOAT:
      uVar1 = args->fp_offset;
      if (uVar1 < 0xa1) {
        local_f8 = (double *)((long)(int)uVar1 + (long)args->reg_save_area);
        args->fp_offset = uVar1 + 0x10;
      }
      else {
        local_f8 = (double *)args->overflow_arg_area;
        args->overflow_arg_area = local_f8 + 1;
      }
      *pfStack_38 = (float)*local_f8;
      pfStack_38 = pfStack_38 + 1;
      break;
    case TYPE_LONG:
      uVar1 = args->gp_offset;
      if (uVar1 < 0x29) {
        local_d8 = (uintptr_t *)((long)(int)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        local_d8 = (uintptr_t *)args->overflow_arg_area;
        args->overflow_arg_area = local_d8 + 1;
      }
      *(uintptr_t *)pfStack_38 = *local_d8;
      pfStack_38 = pfStack_38 + 2;
      break;
    case TYPE_DOUBLE:
      uVar1 = args->fp_offset;
      if (uVar1 < 0xa1) {
        local_118 = (uintptr_t *)((long)(int)uVar1 + (long)args->reg_save_area);
        args->fp_offset = uVar1 + 0x10;
      }
      else {
        local_118 = (uintptr_t *)args->overflow_arg_area;
        args->overflow_arg_area = local_118 + 1;
      }
      *(uintptr_t *)pfStack_38 = *local_118;
      pfStack_38 = pfStack_38 + 2;
    }
    lInfo._4_4_ = lInfo._4_4_ + 1;
  } while( true );
}

Assistant:

const char*	nullcGetArgumentVector(unsigned functionID, uintptr_t extra, va_list args)
{
	using namespace NULLC;

	// Copy arguments in argument buffer
	ExternFuncInfo	&func = linker->exFunctions[functionID];
	char *argPos = argBuf;
	for(unsigned i = 0; i < func.paramCount; i++)
	{
		ExternLocalInfo &lInfo = linker->exLocals[func.offsetToFirstLocal + i];
		ExternTypeInfo &tInfo = linker->exTypes[lInfo.type];
		switch(tInfo.type)
		{
		case ExternTypeInfo::TYPE_VOID:
			break;
		case ExternTypeInfo::TYPE_CHAR:
		case ExternTypeInfo::TYPE_SHORT:
		case ExternTypeInfo::TYPE_INT:
			*(int*)argPos = va_arg(args, int);
			argPos += 4;
			break;
		case ExternTypeInfo::TYPE_LONG:
			*(long long*)argPos = va_arg(args, long long);
			argPos += 8;
			break;
		case ExternTypeInfo::TYPE_FLOAT:
			*(float*)argPos = (float)va_arg(args, double);
			argPos += 4;
			break;
		case ExternTypeInfo::TYPE_DOUBLE:
			*(double*)argPos = va_arg(args, double);
			argPos += 8;
			break;
		case ExternTypeInfo::TYPE_COMPLEX:
			static unsigned autoRefHash = GetStringHash("auto ref");
			static unsigned autoArrayHash = GetStringHash("auto[]");
#ifdef _WIN64
			if(tInfo.size <= 4)
				*(int*)argPos = va_arg(args, int);
			else if(tInfo.size <= 8)
				*(long long*)argPos = va_arg(args, long long);
			else
				memcpy(argPos, va_arg(args, char*), tInfo.size);
			argPos += tInfo.size;
#elif defined(__aarch64__)
			if(tInfo.size <= 4)
			{
				*(int*)argPos = va_arg(args, int);
			}
			else if(tInfo.size <= 8)
			{
				*(long long*)argPos = va_arg(args, long long);
			}
			else if(tInfo.size <= 12)
			{
				*(long long*)argPos = va_arg(args, long long);
				*(long long*)(argPos + 8) = va_arg(args, long long);
			}
			else if(tInfo.size <= 16)
			{
				*(long long*)argPos = va_arg(args, long long);
				*(long long*)(argPos + 8) = va_arg(args, long long);
			}
			else
			{
				memcpy(argPos, va_arg(args, char*), tInfo.size);
			}
			argPos += tInfo.size;
#elif defined(__x86_64__)
			if((tInfo.subCat == ExternTypeInfo::CAT_ARRAY && tInfo.arrSize == ~0u) || tInfo.subCat == ExternTypeInfo::CAT_FUNCTION)
			{
				*(NULLCArray*)argPos = va_arg(args, NULLCArray);
				argPos += 12;
			}else if(tInfo.nameHash == autoRefHash){
				*(NULLCRef*)argPos = va_arg(args, NULLCRef);
				argPos += 12;
			}else if(tInfo.nameHash == autoArrayHash){
				*(NULLCAutoArray*)argPos = va_arg(args, NULLCAutoArray);
				argPos += sizeof(NULLCAutoArray);
			}else if(tInfo.subCat == ExternTypeInfo::CAT_CLASS){
				ExternMemberInfo *memberList = &linker->exTypeExtra[tInfo.memberOffset];
				for(unsigned k = 0; k < tInfo.memberCount; k++)
				{
					const ExternTypeInfo &subType = linker->exTypes[memberList[k].type];
					switch(subType.type)
					{
					case ExternTypeInfo::TYPE_CHAR:
					case ExternTypeInfo::TYPE_SHORT:
					case ExternTypeInfo::TYPE_INT:
						*(int*)argPos = va_arg(args, int);
						argPos += 4;
						break;
					case ExternTypeInfo::TYPE_LONG:
						*(long long*)argPos = va_arg(args, long long);
						argPos += 8;
						break;
					case ExternTypeInfo::TYPE_FLOAT:
						*(float*)argPos = (float)va_arg(args, double);
						argPos += 4;
						break;
					case ExternTypeInfo::TYPE_DOUBLE:
						*(double*)argPos = va_arg(args, double);
						argPos += 8;
						break;
					default:
						nullcLastError = "ERROR: unsupported complex function parameter";
						return NULL;
					}
				}
			}else{
				nullcLastError = "ERROR: unsupported complex function parameter";
				return NULL;
			}
#else
			for(unsigned u = 0; u < tInfo.size >> 2; u++, argPos += 4)
				*(int*)argPos = va_arg(args, int);
#endif
			break;
		}
	}

	memcpy(argPos, &extra, sizeof(extra));
	argPos += sizeof(uintptr_t);

	return argBuf;
}